

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Cluster.c
# Opt level: O3

int Llb_ManComputeCommonQuant(Llb_Mtr_t *p,int iCol1,int iCol2)

{
  char **ppcVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  
  uVar3 = p->nRows - p->nFfs;
  if (uVar3 == 0 || p->nRows < p->nFfs) {
    return 0;
  }
  ppcVar1 = p->pMatrix;
  uVar5 = 0;
  iVar4 = 0;
  do {
    iVar2 = iVar4;
    if (ppcVar1[iCol1][uVar5] == '\0') {
      if (ppcVar1[iCol2][uVar5] == '\x01') {
LAB_0092f117:
        iVar2 = iVar4 + -1;
      }
    }
    else if (ppcVar1[iCol1][uVar5] == '\x01') {
      if (ppcVar1[iCol2][uVar5] == '\0') goto LAB_0092f117;
      if ((ppcVar1[iCol2][uVar5] == '\x01') && (iVar2 = iVar4 + 2, p->pRowSums[uVar5] != 2)) {
        iVar2 = iVar4;
      }
    }
    iVar4 = iVar2;
    uVar5 = uVar5 + 1;
    if (uVar3 == uVar5) {
      return iVar4;
    }
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Llb_ManComputeCommonQuant( Llb_Mtr_t * p, int iCol1, int iCol2 )
{
    int iVar, Weight = 0;
    for ( iVar = 0; iVar < p->nRows - p->nFfs; iVar++ )
    {
        // count each removed variable as 2
        if ( p->pMatrix[iCol1][iVar] == 1 && p->pMatrix[iCol2][iVar] == 1 && p->pRowSums[iVar] == 2 )
            Weight += 2;
        // count each added variale as -1
        else if ( (p->pMatrix[iCol1][iVar] == 1 && p->pMatrix[iCol2][iVar] == 0) || 
                  (p->pMatrix[iCol1][iVar] == 0 && p->pMatrix[iCol2][iVar] == 1) )
            Weight--;
    }
    return Weight;
}